

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_> *this,
          TPZVec<long> *nodeindices,int matind,TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016dd970;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016dcdf8,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016dcaf8;
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::TPZQuadSphere
            (&this->fGeo,nodeindices);
  lVar1 = 0xaf8;
  do {
    *(undefined ***)
     ((long)(&(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoQuad>.super_TPZGeoQuad + -2) + lVar1) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoQuad>.super_TPZGeoQuad.
            super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoQuad>.super_TPZGeoQuad.
            super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + lVar1 + -0x50) =
         0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xbd0);
  for (lVar1 = 0xaf8; lVar1 != 0xbd0; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoQuad>.super_TPZGeoQuad.
            super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + lVar1 + -0x50) =
         0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoQuad>.super_TPZGeoQuad.
            super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + lVar1 + -0x48) =
         0xffffffff;
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::Initialize
            (&(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoQuad>,&this->super_TPZGeoEl);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(nodeindices) {
	
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}